

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void absl::lts_20250127::debugging_internal::Append(State *state,char *str,size_t length)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong local_28;
  size_t i;
  size_t length_local;
  char *str_local;
  State *state_local;
  
  local_28 = 0;
  do {
    if (length <= local_28) {
LAB_00639dc2:
      if ((state->parse_state).out_cur_idx < state->out_end_idx) {
        state->out[(state->parse_state).out_cur_idx] = '\0';
      }
      return;
    }
    if (state->out_end_idx <= (state->parse_state).out_cur_idx + 1) {
      (state->parse_state).out_cur_idx = state->out_end_idx + 1;
      goto LAB_00639dc2;
    }
    cVar1 = str[local_28];
    pcVar3 = state->out;
    iVar2 = (state->parse_state).out_cur_idx;
    (state->parse_state).out_cur_idx = iVar2 + 1;
    pcVar3[iVar2] = cVar1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static void Append(State *state, const char *const str, const size_t length) {
  for (size_t i = 0; i < length; ++i) {
    if (state->parse_state.out_cur_idx + 1 <
        state->out_end_idx) {  // +1 for '\0'
      state->out[state->parse_state.out_cur_idx++] = str[i];
    } else {
      // signal overflow
      state->parse_state.out_cur_idx = state->out_end_idx + 1;
      break;
    }
  }
  if (state->parse_state.out_cur_idx < state->out_end_idx) {
    state->out[state->parse_state.out_cur_idx] =
        '\0';  // Terminate it with '\0'
  }
}